

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

int Sfm_LibNewIsContained(Sfm_Fun_t *pObj,int *pProf,int Area,int *pProfNew,int nFanins)

{
  int local_38;
  int k;
  int nFanins_local;
  int *pProfNew_local;
  int Area_local;
  int *pProf_local;
  Sfm_Fun_t *pObj_local;
  
  if (Area < pObj->Area) {
    pObj_local._4_4_ = 0;
  }
  else {
    for (local_38 = 0; local_38 < nFanins; local_38 = local_38 + 1) {
      if (pProfNew[local_38] < pProf[local_38]) {
        return 0;
      }
    }
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

static inline int Sfm_LibNewIsContained( Sfm_Fun_t * pObj, int * pProf, int Area, int * pProfNew, int nFanins )
{
    int k;
    if ( Area < pObj->Area )
        return 0;
    for ( k = 0; k < nFanins; k++ )
        if ( pProfNew[k] < pProf[k] )
            return 0;
    return 1;
}